

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SwitchIRBuilder.cpp
# Opt level: O0

void __thiscall SwitchIRBuilder::FlushCases(SwitchIRBuilder *this,uint32 targetOffset)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  uint32 targetOffset_local;
  SwitchIRBuilder *this_local;
  
  bVar2 = JsUtil::ReadOnlyList<CaseNode_*,_Memory::JitArenaAllocator,_DefaultComparer>::Empty
                    (&this->m_caseNodes->
                      super_ReadOnlyList<CaseNode_*,_Memory::JitArenaAllocator,_DefaultComparer>);
  if (!bVar2) {
    if ((this->m_switchIntDynProfile & 1U) == 0) {
      if ((this->m_switchStrDynProfile & 1U) == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/SwitchIRBuilder.cpp"
                           ,0x13d,"(false)","false");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
      else {
        BuildMultiBrCaseInstrForStrings(this,targetOffset);
      }
    }
    else {
      BuildCaseBrInstr(this,targetOffset);
    }
  }
  return;
}

Assistant:

void
SwitchIRBuilder::FlushCases(uint32 targetOffset)
{
    if (m_caseNodes->Empty())
    {
        return;
    }

    if (m_switchIntDynProfile)
    {
        BuildCaseBrInstr(targetOffset);
    }
    else if (m_switchStrDynProfile)
    {
        BuildMultiBrCaseInstrForStrings(targetOffset);
    }
    else
    {
        Assert(false);
    }
}